

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

void __thiscall Interpreter::load(Interpreter *this)

{
  pointer *ppCVar1;
  istream *piVar2;
  iterator __position;
  size_t __n;
  char cVar3;
  void *__dest;
  mapped_type *pmVar4;
  uint8_t opcode;
  string str;
  key_type local_71;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  vector<Interpreter::Call,_std::allocator<Interpreter::Call>_> *local_50;
  Call local_48;
  
  local_50 = &this->callList;
  while( true ) {
    std::istream::read((char *)this->s,(long)&local_71);
    piVar2 = (istream *)this->s;
    if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) != 0) break;
    local_68 = 0;
    local_60 = 0;
    local_70 = &local_60;
    cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar2 + -0x18) + (char)piVar2);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar2,(string *)&local_70,cVar3)
    ;
    __n = local_68;
    __dest = malloc(local_68);
    memcpy(__dest,local_70,__n);
    pmVar4 = std::
             map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
             ::operator[](&this->operations,&local_71);
    local_48.func = *pmVar4;
    local_48._8_8_ = pmVar4[1];
    __position._M_current =
         (this->callList).super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.data = __dest;
    if (__position._M_current ==
        (this->callList).super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::
      _M_realloc_insert<Interpreter::Call>(local_50,__position,&local_48);
    }
    else {
      (__position._M_current)->data = __dest;
      (__position._M_current)->func = local_48.func;
      *(undefined8 *)&(__position._M_current)->field_0x8 = local_48._8_8_;
      ppCVar1 = &(this->callList).
                 super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
  }
  return;
}

Assistant:

void Interpreter::load() {
    //load labels
    unsigned int curOp = 0;
/*    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

        if (opcode == op::LABEL) {
#ifdef I_DEBUG
            printf("loaded label: %i pointing to op#%i\n", *str.data(), curOp);
#endif
            labels[*(unsigned int *) str.data()] = curOp;
            continue;
        }

        curOp++;
    }
    s->clear();
    s->seekg(0, std::ios::beg);

    curOp = 0;*/
    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

/*        if (opcode == op::LABEL) {
*//*#ifdef I_DEBUG
            printf("loaded label: %i\n", *str.data());
#endif
            labels[*str.data()] = curOp;*//*
            continue;
        }*/

        unsigned long size = str.size() * sizeof(str[0]);
        void *dataMem = malloc(size);
        memcpy(dataMem, str.data(), size);
#ifdef I_DEBUG
        printf("loaded %i; data size: %i\n", opcode, (int) size);
#endif
        opFunc f = operations[opcode];
        callList.push_back(Call(f, dataMem));
    }
}